

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

logical gai_check_ghost_distr(Integer g_a)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (0 < (long)GA[g_a + 1000].ndim) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      lVar4 = (long)GA[g_a + 1000].nblock[lVar1];
      lVar3 = lVar2;
      if (0 < lVar4) {
        lVar3 = lVar2 + lVar4;
        lVar5 = 0;
        do {
          if (lVar5 < GA[g_a + 1000].nblock[lVar1] + -1) {
            if ((GA[g_a + 1000].mapc[lVar2 + 1] - GA[g_a + 1000].mapc[lVar2]) + 1 <
                GA[g_a + 1000].width[lVar1]) {
              return 0;
            }
          }
          else if ((GA[g_a + 1000].dims[lVar1] - GA[g_a + 1000].mapc[lVar2]) + 1 <
                   GA[g_a + 1000].width[lVar1]) {
            return 0;
          }
          lVar2 = lVar2 + 1;
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      lVar1 = lVar1 + 1;
      lVar2 = lVar3;
    } while (lVar1 != GA[g_a + 1000].ndim);
  }
  return 1;
}

Assistant:

static logical gai_check_ghost_distr(Integer g_a)
{
  Integer handle=GA_OFFSET + g_a;
  Integer idx, ndim, np, ipx;
  ndim = GA[handle].ndim;
  ipx = 0;
  for (idx = 0; idx < ndim; idx++) {
    for (np = 0; np < GA[handle].nblock[idx]; np++) {
      if (np < GA[handle].nblock[idx] - 1) {
        if (GA[handle].mapc[ipx+1]-GA[handle].mapc[ipx]+1
            <GA[handle].width[idx]) {
          return FALSE;
        }
      } else {
        if (GA[handle].dims[idx]-GA[handle].mapc[ipx]+1
            <GA[handle].width[idx]) {
          return FALSE;
        }
      }
      ipx++;
    }
  }
  return TRUE;
}